

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.c
# Opt level: O3

void do_unalias(CHAR_DATA *ch,char *argument)

{
  char *__s2;
  bool bVar1;
  int iVar2;
  long lVar3;
  CHAR_DATA *ch_00;
  char arg [4608];
  char acStack_1238 [4616];
  
  ch_00 = ch;
  if ((ch->desc != (DESCRIPTOR_DATA *)0x0) &&
     (ch_00 = ch->desc->original, ch_00 == (CHAR_DATA *)0x0)) {
    ch_00 = ch;
  }
  bVar1 = is_npc(ch_00);
  if (!bVar1) {
    one_argument(argument,acStack_1238);
    lVar3 = 0;
    bVar1 = false;
    do {
      __s2 = *(char **)((long)ch_00->pcdata->alias + lVar3);
      if (__s2 == (char *)0x0) break;
      if (bVar1) {
        *(char **)(ch_00->pcdata->group_known + lVar3 + 0x30) = __s2;
        *(undefined8 *)((long)ch_00->pcdata->alias + lVar3 + 0x48) =
             *(undefined8 *)((long)ch_00->pcdata->alias_sub + lVar3);
LAB_00272e22:
        *(undefined8 *)((long)ch_00->pcdata->alias + lVar3) = 0;
        *(undefined8 *)((long)ch_00->pcdata->alias_sub + lVar3) = 0;
      }
      else {
        iVar2 = strcmp(acStack_1238,__s2);
        if (iVar2 == 0) {
          send_to_char("Alias removed.\n\r",ch);
          free_pstring(*(char **)((long)ch_00->pcdata->alias + lVar3));
          free_pstring(*(char **)((long)ch_00->pcdata->alias_sub + lVar3));
          bVar1 = true;
          goto LAB_00272e22;
        }
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x50);
    if (!bVar1) {
      send_to_char("No alias of that name to remove.\n\r",ch);
    }
  }
  return;
}

Assistant:

void do_unalias(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *rch;
	char arg[MAX_INPUT_LENGTH];
	int pos;
	bool found = false;

	if (ch->desc == nullptr)
		rch = ch;
	else
		rch = ch->desc->original ? ch->desc->original : ch;

	if (is_npc(rch))
		return;

	argument = one_argument(argument, arg);

	if (arg == (char *)'\0')
	{
		send_to_char("Unalias what?\n\r", ch);
		return;
	}

	for (pos = 0; pos < MAX_ALIAS; pos++)
	{
		if (rch->pcdata->alias[pos] == nullptr)
			break;

		if (found)
		{

			rch->pcdata->alias[pos - 1] = rch->pcdata->alias[pos];
			rch->pcdata->alias_sub[pos - 1] = rch->pcdata->alias_sub[pos];
			rch->pcdata->alias[pos] = nullptr;
			rch->pcdata->alias_sub[pos] = nullptr;
			continue;
		}

		if (!strcmp(arg, rch->pcdata->alias[pos]))
		{
			send_to_char("Alias removed.\n\r", ch);

			free_pstring(rch->pcdata->alias[pos]);
			free_pstring(rch->pcdata->alias_sub[pos]);
			rch->pcdata->alias[pos] = nullptr;
			rch->pcdata->alias_sub[pos] = nullptr;

			found = true;
		}
	}

	if (!found)
		send_to_char("No alias of that name to remove.\n\r", ch);
}